

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O3

void embree::avx2::SphereMiMBIntersectorK<8,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  float fVar1;
  float fVar2;
  float fVar3;
  byte bVar4;
  Scene *pSVar5;
  Geometry *pGVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  RTCFilterFunctionN p_Var10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  float fVar49;
  float fVar57;
  undefined1 auVar50 [16];
  float fVar55;
  float fVar56;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar58 [36];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [64];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined4 uVar69;
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined1 auVar79 [32];
  undefined1 auVar81 [28];
  undefined1 auVar83 [64];
  undefined1 auVar84 [28];
  undefined1 auVar85 [64];
  undefined1 in_ZMM13 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  SphereIntersectorHitM<8> hit;
  HitK<8> h;
  RTCFilterFunctionNArguments local_430;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  RayHitK<8> *local_348;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1b0 [16];
  uint local_1a0 [4];
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  uint local_c0;
  uint uStack_bc;
  uint uStack_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar54 [64];
  undefined1 auVar68 [64];
  undefined1 auVar72 [64];
  undefined1 auVar75 [64];
  undefined1 auVar80 [64];
  undefined1 auVar82 [32];
  
  pSVar5 = context->scene;
  local_1a0[0] = sphere->sharedGeomID;
  uVar27 = (ulong)(sphere->primIDs).field_0.i[0];
  pGVar6 = (pSVar5->geometries).items[local_1a0[0]].ptr;
  fVar1 = (pGVar6->time_range).lower;
  fVar1 = pGVar6->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0xe0) - fVar1) / ((pGVar6->time_range).upper - fVar1));
  auVar50 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
  auVar50 = vminss_avx(auVar50,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
  auVar50 = vmaxss_avx(ZEXT816(0) << 0x20,auVar50);
  lVar7 = *(long *)&pGVar6[2].numPrimitives;
  lVar29 = (long)(int)auVar50._0_4_ * 0x38;
  lVar8 = *(long *)(lVar7 + lVar29);
  lVar9 = *(long *)(lVar7 + 0x10 + lVar29);
  uVar33 = (ulong)(sphere->primIDs).field_0.i[1];
  uVar28 = (ulong)(sphere->primIDs).field_0.i[4];
  auVar40._16_16_ = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar28);
  auVar40._0_16_ = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar27);
  uVar30 = (ulong)(sphere->primIDs).field_0.i[5];
  auVar51._16_16_ = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar30);
  auVar51._0_16_ = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar33);
  uVar32 = (ulong)(sphere->primIDs).field_0.i[2];
  uVar31 = (ulong)(sphere->primIDs).field_0.i[3];
  uVar34 = (ulong)(sphere->primIDs).field_0.i[6];
  auVar59._16_16_ = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar34);
  auVar59._0_16_ = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar32);
  uVar25 = (ulong)(sphere->primIDs).field_0.i[7];
  auVar62._16_16_ = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar25);
  auVar62._0_16_ = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar31);
  lVar8 = *(long *)(lVar7 + 0x38 + lVar29);
  lVar7 = *(long *)(lVar7 + 0x48 + lVar29);
  auVar65._16_16_ = *(undefined1 (*) [16])(lVar8 + uVar28 * lVar7);
  auVar65._0_16_ = *(undefined1 (*) [16])(lVar8 + uVar27 * lVar7);
  auVar70._16_16_ = *(undefined1 (*) [16])(lVar8 + uVar30 * lVar7);
  auVar70._0_16_ = *(undefined1 (*) [16])(lVar8 + uVar33 * lVar7);
  auVar73._16_16_ = *(undefined1 (*) [16])(lVar8 + uVar34 * lVar7);
  auVar73._0_16_ = *(undefined1 (*) [16])(lVar8 + uVar32 * lVar7);
  auVar76._16_16_ = *(undefined1 (*) [16])(lVar8 + lVar7 * uVar25);
  auVar76._0_16_ = *(undefined1 (*) [16])(lVar8 + uVar31 * lVar7);
  bVar4 = sphere->numPrimitives;
  auVar47._1_3_ = 0;
  auVar47[0] = bVar4;
  fVar1 = fVar1 - auVar50._0_4_;
  auVar52 = vunpcklps_avx(auVar40,auVar59);
  auVar44 = vunpckhps_avx(auVar40,auVar59);
  auVar48 = vunpcklps_avx(auVar51,auVar62);
  auVar40 = vunpckhps_avx(auVar51,auVar62);
  auVar51 = vunpcklps_avx(auVar52,auVar48);
  auVar52 = vunpckhps_avx(auVar52,auVar48);
  auVar42 = vunpcklps_avx(auVar44,auVar40);
  auVar44 = vunpckhps_avx(auVar44,auVar40);
  auVar88 = vunpcklps_avx(auVar65,auVar73);
  auVar40 = vunpckhps_avx(auVar65,auVar73);
  auVar14 = vunpcklps_avx(auVar70,auVar76);
  auVar48 = vunpckhps_avx(auVar70,auVar76);
  auVar15 = vunpcklps_avx(auVar88,auVar14);
  auVar88 = vunpckhps_avx(auVar88,auVar14);
  auVar14 = vunpcklps_avx(auVar40,auVar48);
  auVar40 = vunpckhps_avx(auVar40,auVar48);
  fVar13 = 1.0 - fVar1;
  auVar77._4_4_ = fVar13;
  auVar77._0_4_ = fVar13;
  auVar77._8_4_ = fVar13;
  auVar77._12_4_ = fVar13;
  auVar77._16_4_ = fVar13;
  auVar77._20_4_ = fVar13;
  auVar77._24_4_ = fVar13;
  auVar77._28_4_ = fVar13;
  auVar35._8_4_ = 0x3f800000;
  auVar35._0_8_ = 0x3f8000003f800000;
  auVar35._12_4_ = 0x3f800000;
  auVar35._16_4_ = 0x3f800000;
  auVar35._20_4_ = 0x3f800000;
  auVar35._24_4_ = 0x3f800000;
  auVar35._28_4_ = 0x3f800000;
  auVar48._4_4_ = auVar15._4_4_ * fVar1;
  auVar48._0_4_ = auVar15._0_4_ * fVar1;
  auVar48._8_4_ = auVar15._8_4_ * fVar1;
  auVar48._12_4_ = auVar15._12_4_ * fVar1;
  auVar48._16_4_ = auVar15._16_4_ * fVar1;
  auVar48._20_4_ = auVar15._20_4_ * fVar1;
  auVar48._24_4_ = auVar15._24_4_ * fVar1;
  auVar48._28_4_ = auVar15._28_4_;
  auVar80._0_4_ = fVar1 * auVar88._0_4_;
  auVar80._4_4_ = fVar1 * auVar88._4_4_;
  auVar80._8_4_ = fVar1 * auVar88._8_4_;
  auVar80._12_4_ = fVar1 * auVar88._12_4_;
  auVar80._16_4_ = fVar1 * auVar88._16_4_;
  auVar80._20_4_ = fVar1 * auVar88._20_4_;
  auVar80._28_36_ = in_ZMM13._28_36_;
  auVar80._24_4_ = fVar1 * auVar88._24_4_;
  auVar15._4_4_ = fVar1 * auVar14._4_4_;
  auVar15._0_4_ = fVar1 * auVar14._0_4_;
  auVar15._8_4_ = fVar1 * auVar14._8_4_;
  auVar15._12_4_ = fVar1 * auVar14._12_4_;
  auVar15._16_4_ = fVar1 * auVar14._16_4_;
  auVar15._20_4_ = fVar1 * auVar14._20_4_;
  auVar15._24_4_ = fVar1 * auVar14._24_4_;
  auVar15._28_4_ = auVar14._28_4_;
  auVar14._4_4_ = fVar1 * auVar40._4_4_;
  auVar14._0_4_ = fVar1 * auVar40._0_4_;
  auVar14._8_4_ = fVar1 * auVar40._8_4_;
  auVar14._12_4_ = fVar1 * auVar40._12_4_;
  auVar14._16_4_ = fVar1 * auVar40._16_4_;
  auVar14._20_4_ = fVar1 * auVar40._20_4_;
  auVar14._24_4_ = fVar1 * auVar40._24_4_;
  auVar14._28_4_ = auVar88._28_4_;
  auVar50 = vfmadd231ps_fma(auVar48,auVar77,auVar51);
  auVar16 = vfmadd231ps_fma(auVar80._0_32_,auVar77,auVar52);
  auVar17 = vfmadd231ps_fma(auVar15,auVar77,auVar42);
  auVar18 = vfmadd231ps_fma(auVar14,auVar77,auVar44);
  auVar47[4] = bVar4;
  auVar47._5_3_ = 0;
  auVar47[8] = bVar4;
  auVar47._9_3_ = 0;
  auVar47[0xc] = bVar4;
  auVar47._13_3_ = 0;
  auVar47[0x10] = bVar4;
  auVar47._17_3_ = 0;
  auVar47[0x14] = bVar4;
  auVar47._21_3_ = 0;
  auVar47[0x18] = bVar4;
  auVar47._25_3_ = 0;
  auVar47[0x1c] = bVar4;
  auVar47._29_3_ = 0;
  auVar51 = vpcmpgtd_avx2(auVar47,_DAT_01fe9900);
  local_1a0[1] = local_1a0[0];
  local_1a0[2] = local_1a0[0];
  local_1a0[3] = local_1a0[0];
  uStack_190 = local_1a0[0];
  uStack_18c = local_1a0[0];
  uStack_188 = local_1a0[0];
  uStack_184 = local_1a0[0];
  uVar69 = *(undefined4 *)(ray + k * 4);
  auVar52._4_4_ = uVar69;
  auVar52._0_4_ = uVar69;
  auVar52._8_4_ = uVar69;
  auVar52._12_4_ = uVar69;
  auVar52._16_4_ = uVar69;
  auVar52._20_4_ = uVar69;
  auVar52._24_4_ = uVar69;
  auVar52._28_4_ = uVar69;
  uVar69 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar60._4_4_ = uVar69;
  auVar60._0_4_ = uVar69;
  auVar60._8_4_ = uVar69;
  auVar60._12_4_ = uVar69;
  auVar60._16_4_ = uVar69;
  auVar60._20_4_ = uVar69;
  auVar60._24_4_ = uVar69;
  auVar60._28_4_ = uVar69;
  uVar69 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar63._4_4_ = uVar69;
  auVar63._0_4_ = uVar69;
  auVar63._8_4_ = uVar69;
  auVar63._12_4_ = uVar69;
  auVar63._16_4_ = uVar69;
  auVar63._20_4_ = uVar69;
  auVar63._24_4_ = uVar69;
  auVar63._28_4_ = uVar69;
  fVar1 = *(float *)(ray + k * 4 + 0x80);
  auVar79._4_4_ = fVar1;
  auVar79._0_4_ = fVar1;
  auVar79._8_4_ = fVar1;
  auVar79._12_4_ = fVar1;
  auVar79._16_4_ = fVar1;
  auVar79._20_4_ = fVar1;
  auVar79._24_4_ = fVar1;
  auVar79._28_4_ = fVar1;
  auVar80 = ZEXT3264(auVar79);
  fVar2 = *(float *)(ray + k * 4 + 0xa0);
  auVar82._4_4_ = fVar2;
  auVar82._0_4_ = fVar2;
  auVar82._8_4_ = fVar2;
  auVar82._12_4_ = fVar2;
  auVar82._16_4_ = fVar2;
  auVar82._20_4_ = fVar2;
  auVar82._24_4_ = fVar2;
  auVar82._28_4_ = fVar2;
  auVar83 = ZEXT3264(auVar82);
  fVar3 = *(float *)(ray + k * 4 + 0xc0);
  auVar85 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3,CONCAT420(fVar3,CONCAT416(fVar3,CONCAT412(fVar3
                                                  ,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))))))));
  auVar40 = vsubps_avx(ZEXT1632(auVar50),auVar52);
  auVar50 = vfmadd231ps_fma(ZEXT432((uint)(fVar3 * fVar3)),auVar82,auVar82);
  auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar79,auVar79);
  auVar53._0_4_ = auVar50._0_4_;
  auVar53._4_4_ = auVar53._0_4_;
  auVar53._8_4_ = auVar53._0_4_;
  auVar53._12_4_ = auVar53._0_4_;
  auVar53._16_4_ = auVar53._0_4_;
  auVar53._20_4_ = auVar53._0_4_;
  auVar53._24_4_ = auVar53._0_4_;
  auVar53._28_4_ = auVar53._0_4_;
  auVar44 = vrcpps_avx(auVar53);
  auVar52 = vsubps_avx(ZEXT1632(auVar16),auVar60);
  auVar48 = vsubps_avx(ZEXT1632(auVar17),auVar63);
  auVar50 = vfnmadd231ps_fma(auVar35,auVar44,auVar53);
  auVar50 = vfmadd132ps_fma(ZEXT1632(auVar50),auVar44,auVar44);
  auVar88._4_4_ = fVar3 * auVar48._4_4_;
  auVar88._0_4_ = fVar3 * auVar48._0_4_;
  auVar88._8_4_ = fVar3 * auVar48._8_4_;
  auVar88._12_4_ = fVar3 * auVar48._12_4_;
  auVar88._16_4_ = fVar3 * auVar48._16_4_;
  auVar88._20_4_ = fVar3 * auVar48._20_4_;
  auVar88._24_4_ = fVar3 * auVar48._24_4_;
  auVar88._28_4_ = auVar53._0_4_;
  auVar16 = vfmadd231ps_fma(auVar88,auVar52,auVar82);
  auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar40,auVar79);
  fVar49 = auVar16._0_4_ * auVar50._0_4_;
  fVar55 = auVar16._4_4_ * auVar50._4_4_;
  fVar56 = auVar16._8_4_ * auVar50._8_4_;
  fVar57 = auVar16._12_4_ * auVar50._12_4_;
  auVar66._0_4_ = fVar1 * fVar49;
  auVar66._4_4_ = fVar1 * fVar55;
  auVar66._8_4_ = fVar1 * fVar56;
  auVar66._12_4_ = fVar1 * fVar57;
  auVar66._16_4_ = fVar1 * 0.0;
  auVar66._20_4_ = fVar1 * 0.0;
  auVar66._24_4_ = fVar1 * 0.0;
  auVar66._28_4_ = 0;
  auVar42._4_4_ = fVar2 * fVar55;
  auVar42._0_4_ = fVar2 * fVar49;
  auVar42._8_4_ = fVar2 * fVar56;
  auVar42._12_4_ = fVar2 * fVar57;
  auVar42._16_4_ = fVar2 * 0.0;
  auVar42._20_4_ = fVar2 * 0.0;
  auVar42._24_4_ = fVar2 * 0.0;
  auVar42._28_4_ = auVar44._28_4_;
  auVar44._4_4_ = fVar3 * fVar55;
  auVar44._0_4_ = fVar3 * fVar49;
  auVar44._8_4_ = fVar3 * fVar56;
  auVar44._12_4_ = fVar3 * fVar57;
  auVar44._16_4_ = fVar3 * 0.0;
  auVar44._20_4_ = fVar3 * 0.0;
  auVar44._24_4_ = fVar3 * 0.0;
  auVar44._28_4_ = fVar13;
  auVar40 = vsubps_avx(auVar40,auVar66);
  auVar86 = ZEXT3264(auVar40);
  auVar88 = vsubps_avx(auVar52,auVar42);
  auVar87 = ZEXT3264(auVar88);
  auVar48 = vsubps_avx(auVar48,auVar44);
  auVar89 = ZEXT3264(auVar48);
  auVar19._4_4_ = auVar48._4_4_ * auVar48._4_4_;
  auVar19._0_4_ = auVar48._0_4_ * auVar48._0_4_;
  auVar19._8_4_ = auVar48._8_4_ * auVar48._8_4_;
  auVar19._12_4_ = auVar48._12_4_ * auVar48._12_4_;
  auVar19._16_4_ = auVar48._16_4_ * auVar48._16_4_;
  auVar19._20_4_ = auVar48._20_4_ * auVar48._20_4_;
  auVar19._24_4_ = auVar48._24_4_ * auVar48._24_4_;
  auVar19._28_4_ = auVar52._28_4_;
  auVar16 = vfmadd231ps_fma(auVar19,auVar88,auVar88);
  auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar40,auVar40);
  auVar42 = ZEXT1632(CONCAT412(auVar18._12_4_ * auVar18._12_4_,
                               CONCAT48(auVar18._8_4_ * auVar18._8_4_,
                                        CONCAT44(auVar18._4_4_ * auVar18._4_4_,
                                                 auVar18._0_4_ * auVar18._0_4_))));
  auVar44 = vcmpps_avx(ZEXT1632(auVar16),auVar42,2);
  auVar52 = auVar51 & auVar44;
  if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar52 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar52 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar52 >> 0x7f,0) != '\0') ||
        (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar52 >> 0xbf,0) != '\0') ||
      (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar52[0x1f] < '\0') {
    auVar44 = vandps_avx(auVar44,auVar51);
    auVar17 = vpackssdw_avx(auVar44._0_16_,auVar44._16_16_);
    auVar44 = vsubps_avx(auVar42,ZEXT1632(auVar16));
    auVar36._0_4_ = auVar50._0_4_ * auVar44._0_4_;
    auVar36._4_4_ = auVar50._4_4_ * auVar44._4_4_;
    auVar36._8_4_ = auVar50._8_4_ * auVar44._8_4_;
    auVar36._12_4_ = auVar50._12_4_ * auVar44._12_4_;
    auVar36._16_4_ = auVar44._16_4_ * 0.0;
    auVar36._20_4_ = auVar44._20_4_ * 0.0;
    auVar36._24_4_ = auVar44._24_4_ * 0.0;
    auVar36._28_4_ = 0;
    auVar51 = vsqrtps_avx(auVar36);
    auVar64 = ZEXT3264(auVar51);
    auVar42 = vsubps_avx(ZEXT1632(CONCAT412(fVar57,CONCAT48(fVar56,CONCAT44(fVar55,fVar49)))),
                         auVar51);
    auVar67._0_4_ = fVar49 + auVar51._0_4_;
    auVar67._4_4_ = fVar55 + auVar51._4_4_;
    auVar67._8_4_ = fVar56 + auVar51._8_4_;
    auVar67._12_4_ = fVar57 + auVar51._12_4_;
    auVar67._16_4_ = auVar51._16_4_ + 0.0;
    auVar67._20_4_ = auVar51._20_4_ + 0.0;
    auVar67._24_4_ = auVar51._24_4_ + 0.0;
    auVar67._28_4_ = auVar51._28_4_ + 0.0;
    auVar68 = ZEXT3264(auVar67);
    uVar69 = *(undefined4 *)(ray + k * 4 + 0x60);
    auVar37._4_4_ = uVar69;
    auVar37._0_4_ = uVar69;
    auVar37._8_4_ = uVar69;
    auVar37._12_4_ = uVar69;
    auVar37._16_4_ = uVar69;
    auVar37._20_4_ = uVar69;
    auVar37._24_4_ = uVar69;
    auVar37._28_4_ = uVar69;
    auVar44 = vcmpps_avx(auVar37,auVar42,2);
    uVar69 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar71._4_4_ = uVar69;
    auVar71._0_4_ = uVar69;
    auVar71._8_4_ = uVar69;
    auVar71._12_4_ = uVar69;
    auVar71._16_4_ = uVar69;
    auVar71._20_4_ = uVar69;
    auVar71._24_4_ = uVar69;
    auVar71._28_4_ = uVar69;
    auVar72 = ZEXT3264(auVar71);
    auVar52 = vcmpps_avx(auVar42,auVar71,2);
    auVar44 = vandps_avx(auVar44,auVar52);
    auVar50 = vpackssdw_avx(auVar44._0_16_,auVar44._16_16_);
    auVar16 = vpand_avx(auVar50,auVar17);
    auVar44 = vcmpps_avx(auVar37,auVar67,2);
    auVar52 = vcmpps_avx(auVar67,auVar71,2);
    auVar44 = vandps_avx(auVar44,auVar52);
    auVar50 = vpackssdw_avx(auVar44._0_16_,auVar44._16_16_);
    local_1b0 = vpand_avx(auVar50,auVar17);
    auVar50 = vpor_avx(auVar16,local_1b0);
    local_400 = vpmovsxwd_avx2(auVar50);
    if ((((((((local_400 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_400 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_400 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_400 >> 0x7f,0) != '\0') ||
          (local_400 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_400 >> 0xbf,0) != '\0') ||
        (local_400 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_400[0x1f] < '\0') {
      auVar52 = vpmovsxwd_avx2(auVar16);
      local_340 = vblendvps_avx(auVar67,auVar42,auVar52);
      auVar43._0_8_ = auVar51._0_8_ ^ 0x8000000080000000;
      auVar43._8_4_ = -auVar51._8_4_;
      auVar43._12_4_ = -auVar51._12_4_;
      auVar43._16_4_ = -auVar51._16_4_;
      auVar43._20_4_ = -auVar51._20_4_;
      auVar43._24_4_ = -auVar51._24_4_;
      auVar43._28_4_ = -auVar51._28_4_;
      auVar44 = vblendvps_avx(auVar51,auVar43,auVar52);
      fVar13 = auVar44._0_4_;
      fVar49 = auVar44._4_4_;
      auVar20._4_4_ = fVar1 * fVar49;
      auVar20._0_4_ = fVar1 * fVar13;
      fVar55 = auVar44._8_4_;
      auVar20._8_4_ = fVar1 * fVar55;
      fVar56 = auVar44._12_4_;
      auVar20._12_4_ = fVar1 * fVar56;
      fVar57 = auVar44._16_4_;
      auVar20._16_4_ = fVar1 * fVar57;
      fVar11 = auVar44._20_4_;
      auVar20._20_4_ = fVar1 * fVar11;
      fVar12 = auVar44._24_4_;
      auVar20._24_4_ = fVar1 * fVar12;
      auVar20._28_4_ = 0x80000000;
      auVar21._4_4_ = fVar2 * fVar49;
      auVar21._0_4_ = fVar2 * fVar13;
      auVar21._8_4_ = fVar2 * fVar55;
      auVar21._12_4_ = fVar2 * fVar56;
      auVar21._16_4_ = fVar2 * fVar57;
      auVar21._20_4_ = fVar2 * fVar11;
      auVar21._24_4_ = fVar2 * fVar12;
      auVar21._28_4_ = auVar52._28_4_;
      auVar22._4_4_ = fVar3 * fVar49;
      auVar22._0_4_ = fVar3 * fVar13;
      auVar22._8_4_ = fVar3 * fVar55;
      auVar22._12_4_ = fVar3 * fVar56;
      auVar22._16_4_ = fVar3 * fVar57;
      auVar22._20_4_ = fVar3 * fVar11;
      auVar22._24_4_ = fVar3 * fVar12;
      auVar22._28_4_ = auVar44._28_4_;
      local_320 = vsubps_avx(auVar20,auVar40);
      local_300 = vsubps_avx(auVar21,auVar88);
      local_2e0 = vsubps_avx(auVar22,auVar48);
      auVar61 = ZEXT3264(local_340);
      auVar44 = vpmovzxwd_avx2(auVar50);
      auVar44 = vpslld_avx2(auVar44,0x1f);
      auVar74._8_4_ = 0x7f800000;
      auVar74._0_8_ = 0x7f8000007f800000;
      auVar74._12_4_ = 0x7f800000;
      auVar74._16_4_ = 0x7f800000;
      auVar74._20_4_ = 0x7f800000;
      auVar74._24_4_ = 0x7f800000;
      auVar74._28_4_ = 0x7f800000;
      auVar75 = ZEXT3264(auVar74);
      auVar44 = vblendvps_avx(auVar74,local_340,auVar44);
      auVar40 = vshufps_avx(auVar44,auVar44,0xb1);
      auVar40 = vminps_avx(auVar44,auVar40);
      auVar52 = vshufpd_avx(auVar40,auVar40,5);
      auVar40 = vminps_avx(auVar40,auVar52);
      auVar48 = vpermpd_avx2(auVar40,0x4e);
      auVar40 = vminps_avx(auVar40,auVar48);
      auVar40 = vcmpps_avx(auVar44,auVar40,0);
      auVar52 = local_400 & auVar40;
      auVar44 = local_400;
      if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar52 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar52 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar52 >> 0x7f,0) != '\0') ||
            (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar52 >> 0xbf,0) != '\0') ||
          (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar52[0x1f] < '\0') {
        auVar44 = vandps_avx(auVar40,local_400);
      }
      uVar23 = vmovmskps_avx(auVar44);
      uVar24 = 0;
      for (; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x80000000) {
        uVar24 = uVar24 + 1;
      }
      iVar26 = 1 << ((uint)k & 0x1f);
      auVar38._4_4_ = iVar26;
      auVar38._0_4_ = iVar26;
      auVar38._8_4_ = iVar26;
      auVar38._12_4_ = iVar26;
      auVar38._16_4_ = iVar26;
      auVar38._20_4_ = iVar26;
      auVar38._24_4_ = iVar26;
      auVar38._28_4_ = iVar26;
      auVar40 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
      auVar44 = vpand_avx2(auVar38,auVar40);
      auVar44 = vpcmpeqd_avx2(auVar44,auVar40);
      auVar78 = ZEXT3264(auVar44);
      local_348 = ray;
      do {
        local_430.hit = (RTCHitN *)&local_180;
        local_430.valid = (int *)local_3c0;
        auVar88 = auVar89._0_32_;
        auVar52 = auVar87._0_32_;
        auVar40 = auVar86._0_32_;
        auVar84 = auVar85._0_28_;
        auVar81 = auVar83._0_28_;
        auVar44 = auVar80._0_32_;
        auVar58 = ZEXT436(auVar48._28_4_);
        uVar25 = (ulong)uVar24;
        local_c0 = local_1a0[uVar25];
        pGVar6 = (pSVar5->geometries).items[local_c0].ptr;
        local_430.ray = (RTCRayN *)ray;
        if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          *(undefined4 *)(local_400 + uVar25 * 4) = 0;
          auVar58 = ZEXT436(auVar48._28_4_);
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            auVar72 = ZEXT464(*(uint *)(local_340 + uVar25 * 4));
            *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_340 + uVar25 * 4);
            *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_320 + uVar25 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_300 + uVar25 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_2e0 + uVar25 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1e0) = 0;
            *(undefined4 *)(ray + k * 4 + 0x200) = 0;
            *(uint *)(ray + k * 4 + 0x220) = (sphere->primIDs).field_0.i[uVar25];
            *(uint *)(ray + k * 4 + 0x240) = local_c0;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
LAB_018443b5:
            auVar16 = vpand_avx(local_1b0,auVar16);
            uVar69 = auVar72._0_4_;
            auVar45._4_4_ = uVar69;
            auVar45._0_4_ = uVar69;
            auVar45._8_4_ = uVar69;
            auVar45._12_4_ = uVar69;
            auVar45._16_4_ = uVar69;
            auVar45._20_4_ = uVar69;
            auVar45._24_4_ = uVar69;
            auVar45._28_4_ = uVar69;
            local_340 = auVar68._0_32_;
            auVar48 = vcmpps_avx(local_340,auVar45,2);
            auVar50 = vpackssdw_avx(auVar48._0_16_,auVar48._16_16_);
            auVar50 = vpand_avx(auVar50,auVar16);
            auVar48 = vpmovzxwd_avx2(auVar50);
            auVar48 = vpslld_avx2(auVar48,0x1f);
            if ((((((((auVar48 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar48 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar48 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar48 >> 0x7f,0) == '\0') &&
                  (auVar48 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar48 >> 0xbf,0) == '\0') &&
                (auVar48 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar48[0x1f]) {
              return;
            }
            local_400 = vpsrad_avx2(auVar48,0x1f);
            fVar1 = auVar64._0_4_;
            auVar83._0_4_ = auVar44._0_4_ * fVar1;
            fVar2 = auVar64._4_4_;
            auVar83._4_4_ = auVar44._4_4_ * fVar2;
            fVar3 = auVar64._8_4_;
            auVar83._8_4_ = auVar44._8_4_ * fVar3;
            fVar13 = auVar64._12_4_;
            auVar83._12_4_ = auVar44._12_4_ * fVar13;
            fVar49 = auVar64._16_4_;
            auVar83._16_4_ = auVar44._16_4_ * fVar49;
            fVar55 = auVar64._20_4_;
            auVar83._20_4_ = auVar44._20_4_ * fVar55;
            fVar56 = auVar64._24_4_;
            auVar83._24_4_ = auVar44._24_4_ * fVar56;
            auVar83._28_36_ = auVar58;
            auVar85._0_4_ = auVar81._0_4_ * fVar1;
            auVar85._4_4_ = auVar81._4_4_ * fVar2;
            auVar85._8_4_ = auVar81._8_4_ * fVar3;
            auVar85._12_4_ = auVar81._12_4_ * fVar13;
            auVar85._16_4_ = auVar81._16_4_ * fVar49;
            auVar85._20_4_ = auVar81._20_4_ * fVar55;
            auVar85._28_36_ = auVar61._28_36_;
            auVar85._24_4_ = auVar81._24_4_ * fVar56;
            auVar86._0_4_ = auVar84._0_4_ * fVar1;
            auVar86._4_4_ = auVar84._4_4_ * fVar2;
            auVar86._8_4_ = auVar84._8_4_ * fVar3;
            auVar86._12_4_ = auVar84._12_4_ * fVar13;
            auVar86._16_4_ = auVar84._16_4_ * fVar49;
            auVar86._20_4_ = auVar84._20_4_ * fVar55;
            auVar86._28_36_ = auVar64._28_36_;
            auVar86._24_4_ = auVar84._24_4_ * fVar56;
            local_320 = vsubps_avx(auVar83._0_32_,auVar40);
            local_300 = vsubps_avx(auVar85._0_32_,auVar52);
            local_2e0 = vsubps_avx(auVar86._0_32_,auVar88);
            pSVar5 = context->scene;
            auVar40 = vblendvps_avx(auVar75._0_32_,local_340,auVar48);
            auVar52 = vshufps_avx(auVar40,auVar40,0xb1);
            auVar52 = vminps_avx(auVar40,auVar52);
            auVar48 = vshufpd_avx(auVar52,auVar52,5);
            auVar52 = vminps_avx(auVar52,auVar48);
            auVar48 = vpermpd_avx2(auVar52,0x4e);
            auVar52 = vminps_avx(auVar52,auVar48);
            auVar40 = vcmpps_avx(auVar40,auVar52,0);
            auVar16 = vpackssdw_avx(auVar40._0_16_,auVar40._16_16_);
            auVar50 = vpand_avx(auVar16,auVar50);
            auVar40 = vpmovzxwd_avx2(auVar50);
            auVar40 = vpslld_avx2(auVar40,0x1f);
            if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar40 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar40 >> 0x7f,0) == '\0') &&
                  (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar40 >> 0xbf,0) == '\0') &&
                (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar40[0x1f]) {
              auVar40 = local_400;
            }
            uVar23 = vmovmskps_avx(auVar40);
            uVar24 = 0;
            for (; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x80000000) {
              uVar24 = uVar24 + 1;
            }
            auVar80 = ZEXT864(0) << 0x20;
            auVar44 = vpcmpeqd_avx2(auVar44,auVar44);
            auVar83 = ZEXT3264(auVar44);
            do {
              local_430.hit = (RTCHitN *)&local_180;
              local_430.valid = (int *)local_3c0;
              uVar25 = (ulong)uVar24;
              local_c0 = local_1a0[uVar25];
              pGVar6 = (pSVar5->geometries).items[local_c0].ptr;
              if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_400 + uVar25 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_340 + uVar25 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_320 + uVar25 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_300 + uVar25 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_2e0 + uVar25 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = 0;
                  *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                  *(uint *)(ray + k * 4 + 0x220) = (sphere->primIDs).field_0.i[uVar25];
                  *(uint *)(ray + k * 4 + 0x240) = local_c0;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  return;
                }
                local_e0 = (sphere->primIDs).field_0.i[uVar25];
                local_180 = *(undefined4 *)(local_320 + uVar25 * 4);
                local_160._4_4_ = *(undefined4 *)(local_300 + uVar25 * 4);
                uVar69 = *(undefined4 *)(local_2e0 + uVar25 * 4);
                local_140._4_4_ = uVar69;
                local_140._0_4_ = uVar69;
                local_140._8_4_ = uVar69;
                local_140._12_4_ = uVar69;
                local_140._16_4_ = uVar69;
                local_140._20_4_ = uVar69;
                local_140._24_4_ = uVar69;
                local_140._28_4_ = uVar69;
                uStack_17c = local_180;
                uStack_178 = local_180;
                uStack_174 = local_180;
                uStack_170 = local_180;
                uStack_16c = local_180;
                uStack_168 = local_180;
                uStack_164 = local_180;
                local_160._0_4_ = local_160._4_4_;
                local_160._8_4_ = local_160._4_4_;
                local_160._12_4_ = local_160._4_4_;
                local_160._16_4_ = local_160._4_4_;
                local_160._20_4_ = local_160._4_4_;
                local_160._24_4_ = local_160._4_4_;
                local_160._28_4_ = local_160._4_4_;
                local_100 = auVar80._0_32_;
                local_120 = auVar80._0_32_;
                uStack_dc = local_e0;
                uStack_d8 = local_e0;
                uStack_d4 = local_e0;
                uStack_d0 = local_e0;
                uStack_cc = local_e0;
                uStack_c8 = local_e0;
                uStack_c4 = local_e0;
                uStack_bc = local_c0;
                uStack_b8 = local_c0;
                uStack_b4 = local_c0;
                uStack_b0 = local_c0;
                uStack_ac = local_c0;
                uStack_a8 = local_c0;
                uStack_a4 = local_c0;
                uStack_9c = context->user->instID[0];
                local_a0 = uStack_9c;
                uStack_98 = uStack_9c;
                uStack_94 = uStack_9c;
                uStack_90 = uStack_9c;
                uStack_8c = uStack_9c;
                uStack_88 = uStack_9c;
                uStack_84 = uStack_9c;
                uStack_7c = context->user->instPrimID[0];
                local_80 = uStack_7c;
                uStack_78 = uStack_7c;
                uStack_74 = uStack_7c;
                uStack_70 = uStack_7c;
                uStack_6c = uStack_7c;
                uStack_68 = uStack_7c;
                uStack_64 = uStack_7c;
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_340 + uVar25 * 4);
                local_3c0 = auVar78._0_32_;
                local_430.geometryUserPtr = pGVar6->userPtr;
                local_430.context = context->user;
                local_430.N = 8;
                local_430.ray = (RTCRayN *)ray;
                if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  local_3e0 = auVar68._0_32_;
                  local_380 = auVar72._0_32_;
                  auVar44 = ZEXT1632(auVar83._0_16_);
                  local_3a0 = local_3c0;
                  (*pGVar6->intersectionFilterN)(&local_430);
                  auVar44 = vpcmpeqd_avx2(auVar44,auVar44);
                  auVar83 = ZEXT3264(auVar44);
                  auVar80 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar78 = ZEXT3264(local_3a0);
                  auVar72 = ZEXT3264(local_380);
                  auVar68 = ZEXT3264(local_3e0);
                }
                auVar40 = vpcmpeqd_avx2(local_3c0,auVar80._0_32_);
                auVar44 = auVar83._0_32_ & ~auVar40;
                if ((((((((auVar44 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar44 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar44 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar44 >> 0x7f,0) == '\0') &&
                      (auVar44 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar44 >> 0xbf,0) == '\0') &&
                    (auVar44 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar44[0x1f]) {
                  auVar40 = auVar83._0_32_ ^ auVar40;
                  auVar75 = ZEXT3264(CONCAT428(0x7f800000,
                                               CONCAT424(0x7f800000,
                                                         CONCAT420(0x7f800000,
                                                                   CONCAT416(0x7f800000,
                                                                             CONCAT412(0x7f800000,
                                                                                       CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                }
                else {
                  p_Var10 = context->args->filter;
                  if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    local_3e0 = auVar68._0_32_;
                    local_380 = auVar72._0_32_;
                    local_3a0 = auVar78._0_32_;
                    auVar44 = ZEXT1632(auVar83._0_16_);
                    (*p_Var10)(&local_430);
                    auVar44 = vpcmpeqd_avx2(auVar44,auVar44);
                    auVar83 = ZEXT3264(auVar44);
                    auVar80 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar78 = ZEXT3264(local_3a0);
                    auVar72 = ZEXT3264(local_380);
                    auVar68 = ZEXT3264(local_3e0);
                  }
                  auVar52 = vpcmpeqd_avx2(local_3c0,auVar80._0_32_);
                  auVar40 = auVar83._0_32_ ^ auVar52;
                  auVar44 = auVar83._0_32_ & ~auVar52;
                  auVar75 = ZEXT3264(CONCAT428(0x7f800000,
                                               CONCAT424(0x7f800000,
                                                         CONCAT420(0x7f800000,
                                                                   CONCAT416(0x7f800000,
                                                                             CONCAT412(0x7f800000,
                                                                                       CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  if ((((((((auVar44 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar44 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar44 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar44 >> 0x7f,0) != '\0') ||
                        (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar44 >> 0xbf,0) != '\0') ||
                      (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar44[0x1f] < '\0') {
                    auVar46._0_4_ = auVar83._0_4_ ^ auVar52._0_4_;
                    auVar46._4_4_ = auVar83._4_4_ ^ auVar52._4_4_;
                    auVar46._8_4_ = auVar83._8_4_ ^ auVar52._8_4_;
                    auVar46._12_4_ = auVar83._12_4_ ^ auVar52._12_4_;
                    auVar46._16_4_ = auVar83._16_4_ ^ auVar52._16_4_;
                    auVar46._20_4_ = auVar83._20_4_ ^ auVar52._20_4_;
                    auVar46._24_4_ = auVar83._24_4_ ^ auVar52._24_4_;
                    auVar46._28_4_ = auVar83._28_4_ ^ auVar52._28_4_;
                    auVar44 = vmaskmovps_avx(auVar46,*(undefined1 (*) [32])local_430.hit);
                    *(undefined1 (*) [32])(local_430.ray + 0x180) = auVar44;
                    auVar44 = vmaskmovps_avx(auVar46,*(undefined1 (*) [32])(local_430.hit + 0x20));
                    *(undefined1 (*) [32])(local_430.ray + 0x1a0) = auVar44;
                    auVar44 = vmaskmovps_avx(auVar46,*(undefined1 (*) [32])(local_430.hit + 0x40));
                    *(undefined1 (*) [32])(local_430.ray + 0x1c0) = auVar44;
                    auVar44 = vmaskmovps_avx(auVar46,*(undefined1 (*) [32])(local_430.hit + 0x60));
                    *(undefined1 (*) [32])(local_430.ray + 0x1e0) = auVar44;
                    auVar44 = vmaskmovps_avx(auVar46,*(undefined1 (*) [32])(local_430.hit + 0x80));
                    *(undefined1 (*) [32])(local_430.ray + 0x200) = auVar44;
                    auVar44 = vpmaskmovd_avx2(auVar46,*(undefined1 (*) [32])(local_430.hit + 0xa0));
                    *(undefined1 (*) [32])(local_430.ray + 0x220) = auVar44;
                    auVar44 = vpmaskmovd_avx2(auVar46,*(undefined1 (*) [32])(local_430.hit + 0xc0));
                    *(undefined1 (*) [32])(local_430.ray + 0x240) = auVar44;
                    auVar44 = vpmaskmovd_avx2(auVar46,*(undefined1 (*) [32])(local_430.hit + 0xe0));
                    *(undefined1 (*) [32])(local_430.ray + 0x260) = auVar44;
                    auVar44 = vpmaskmovd_avx2(auVar46,*(undefined1 (*) [32])(local_430.hit + 0x100))
                    ;
                    *(undefined1 (*) [32])(local_430.ray + 0x280) = auVar44;
                  }
                }
                if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar40 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar40 >> 0x7f,0) == '\0') &&
                      (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar40 >> 0xbf,0) == '\0') &&
                    (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar40[0x1f]) {
                  *(int *)(ray + k * 4 + 0x100) = auVar72._0_4_;
                }
                else {
                  auVar72 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                }
                *(undefined4 *)(local_400 + uVar25 * 4) = 0;
                uVar69 = auVar72._0_4_;
                auVar41._4_4_ = uVar69;
                auVar41._0_4_ = uVar69;
                auVar41._8_4_ = uVar69;
                auVar41._12_4_ = uVar69;
                auVar41._16_4_ = uVar69;
                auVar41._20_4_ = uVar69;
                auVar41._24_4_ = uVar69;
                auVar41._28_4_ = uVar69;
                auVar44 = vcmpps_avx(auVar68._0_32_,auVar41,2);
                local_400 = vandps_avx(auVar44,local_400);
              }
              if ((((((((local_400 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_400 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_400 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_400 >> 0x7f,0) == '\0') &&
                    (local_400 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_400 >> 0xbf,0) == '\0') &&
                  (local_400 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_400[0x1f]) {
                return;
              }
              auVar44 = vblendvps_avx(auVar75._0_32_,auVar68._0_32_,local_400);
              auVar40 = vshufps_avx(auVar44,auVar44,0xb1);
              auVar40 = vminps_avx(auVar44,auVar40);
              auVar52 = vshufpd_avx(auVar40,auVar40,5);
              auVar40 = vminps_avx(auVar40,auVar52);
              auVar52 = vpermpd_avx2(auVar40,0x4e);
              auVar40 = vminps_avx(auVar40,auVar52);
              auVar40 = vcmpps_avx(auVar44,auVar40,0);
              auVar52 = local_400 & auVar40;
              auVar44 = local_400;
              if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar52 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar52 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar52 >> 0x7f,0) != '\0') ||
                    (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar52 >> 0xbf,0) != '\0') ||
                  (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar52[0x1f] < '\0') {
                auVar44 = vandps_avx(auVar40,local_400);
              }
              uVar23 = vmovmskps_avx(auVar44);
              uVar24 = 0;
              for (; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x80000000) {
                uVar24 = uVar24 + 1;
              }
            } while( true );
          }
          local_1e0 = auVar61._0_32_;
          local_e0 = (sphere->primIDs).field_0.i[uVar25];
          local_180 = *(undefined4 *)(local_320 + uVar25 * 4);
          uVar69 = *(undefined4 *)(local_300 + uVar25 * 4);
          auVar50._4_4_ = uVar69;
          auVar50._0_4_ = uVar69;
          auVar50._8_4_ = uVar69;
          auVar50._12_4_ = uVar69;
          local_160._16_4_ = uVar69;
          local_160._0_16_ = auVar50;
          local_160._20_4_ = uVar69;
          local_160._24_4_ = uVar69;
          local_160._28_4_ = uVar69;
          auVar54 = ZEXT3264(local_160);
          local_140._4_4_ = *(undefined4 *)(local_2e0 + uVar25 * 4);
          uStack_17c = local_180;
          uStack_178 = local_180;
          uStack_174 = local_180;
          uStack_170 = local_180;
          uStack_16c = local_180;
          uStack_168 = local_180;
          uStack_164 = local_180;
          local_140._0_4_ = local_140._4_4_;
          local_140._8_4_ = local_140._4_4_;
          local_140._12_4_ = local_140._4_4_;
          local_140._16_4_ = local_140._4_4_;
          local_140._20_4_ = local_140._4_4_;
          local_140._24_4_ = local_140._4_4_;
          local_140._28_4_ = local_140._4_4_;
          local_100 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          local_120 = local_100;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          uStack_bc = local_c0;
          uStack_b8 = local_c0;
          uStack_b4 = local_c0;
          uStack_b0 = local_c0;
          uStack_ac = local_c0;
          uStack_a8 = local_c0;
          uStack_a4 = local_c0;
          auVar48 = vpcmpeqd_avx2(local_100,local_100);
          uStack_9c = context->user->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = context->user->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_340 + uVar25 * 4);
          local_3c0 = auVar78._0_32_;
          local_430.geometryUserPtr = pGVar6->userPtr;
          local_430.context = context->user;
          local_430.N = 8;
          if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            local_3e0 = auVar68._0_32_;
            local_380 = auVar72._0_32_;
            local_220 = auVar83._0_32_;
            local_240 = auVar85._0_32_;
            local_2c0 = auVar64._0_32_;
            auVar48 = ZEXT1632(auVar48._0_16_);
            auVar54 = ZEXT1664(auVar50);
            local_3a0 = local_3c0;
            local_2a0 = auVar88;
            local_280 = auVar52;
            local_260 = auVar40;
            local_200 = auVar44;
            (*pGVar6->intersectionFilterN)(&local_430);
            auVar48 = vpcmpeqd_avx2(auVar48,auVar48);
            auVar64 = ZEXT3264(local_2c0);
            auVar89 = ZEXT3264(local_2a0);
            auVar87 = ZEXT3264(local_280);
            auVar86 = ZEXT3264(local_260);
            auVar85 = ZEXT3264(local_240);
            auVar83 = ZEXT3264(local_220);
            auVar80 = ZEXT3264(local_200);
            auVar78 = ZEXT3264(local_3a0);
            auVar75 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
            auVar72 = ZEXT3264(local_380);
            auVar68 = ZEXT3264(local_3e0);
          }
          auVar52 = auVar54._0_32_;
          auVar40 = vpcmpeqd_avx2(local_3c0,_DAT_01faff00);
          auVar44 = auVar48 & ~auVar40;
          if ((((((((auVar44 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar44 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar44 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar44 >> 0x7f,0) == '\0') &&
                (auVar44 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar44 >> 0xbf,0) == '\0') &&
              (auVar44 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar44[0x1f]) {
            auVar40 = auVar40 ^ auVar48;
            auVar61 = ZEXT3264(local_1e0);
          }
          else {
            p_Var10 = context->args->filter;
            auVar61 = ZEXT3264(local_1e0);
            if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
              local_3e0 = auVar68._0_32_;
              local_380 = auVar72._0_32_;
              local_3a0 = auVar78._0_32_;
              local_200 = auVar80._0_32_;
              local_220 = auVar83._0_32_;
              local_240 = auVar85._0_32_;
              local_260 = auVar86._0_32_;
              local_280 = auVar87._0_32_;
              local_2a0 = auVar89._0_32_;
              local_2c0 = auVar64._0_32_;
              auVar48 = ZEXT1632(auVar48._0_16_);
              auVar52 = ZEXT1632(auVar54._0_16_);
              (*p_Var10)(&local_430);
              auVar61 = ZEXT3264(local_1e0);
              auVar64 = ZEXT3264(local_2c0);
              auVar89 = ZEXT3264(local_2a0);
              auVar87 = ZEXT3264(local_280);
              auVar86 = ZEXT3264(local_260);
              auVar85 = ZEXT3264(local_240);
              auVar83 = ZEXT3264(local_220);
              auVar80 = ZEXT3264(local_200);
              auVar78 = ZEXT3264(local_3a0);
              auVar75 = ZEXT3264(CONCAT428(0x7f800000,
                                           CONCAT424(0x7f800000,
                                                     CONCAT420(0x7f800000,
                                                               CONCAT416(0x7f800000,
                                                                         CONCAT412(0x7f800000,
                                                                                   CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar72 = ZEXT3264(local_380);
              auVar68 = ZEXT3264(local_3e0);
            }
            auVar88 = vpcmpeqd_avx2(local_3c0,_DAT_01faff00);
            auVar44 = vpcmpeqd_avx2(auVar52,auVar52);
            auVar54 = ZEXT3264(auVar44);
            auVar40 = auVar88 ^ auVar44;
            auVar52 = vpcmpeqd_avx2(auVar48,auVar48);
            auVar44 = auVar44 & ~auVar88;
            if ((((((((auVar44 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar44 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar44 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar44 >> 0x7f,0) != '\0') ||
                  (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar44 >> 0xbf,0) != '\0') ||
                (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar44[0x1f] < '\0') {
              auVar88 = auVar88 ^ auVar52;
              auVar44 = vmaskmovps_avx(auVar88,*(undefined1 (*) [32])local_430.hit);
              *(undefined1 (*) [32])(local_430.ray + 0x180) = auVar44;
              auVar44 = vmaskmovps_avx(auVar88,*(undefined1 (*) [32])(local_430.hit + 0x20));
              *(undefined1 (*) [32])(local_430.ray + 0x1a0) = auVar44;
              auVar44 = vmaskmovps_avx(auVar88,*(undefined1 (*) [32])(local_430.hit + 0x40));
              *(undefined1 (*) [32])(local_430.ray + 0x1c0) = auVar44;
              auVar44 = vmaskmovps_avx(auVar88,*(undefined1 (*) [32])(local_430.hit + 0x60));
              *(undefined1 (*) [32])(local_430.ray + 0x1e0) = auVar44;
              auVar44 = vmaskmovps_avx(auVar88,*(undefined1 (*) [32])(local_430.hit + 0x80));
              *(undefined1 (*) [32])(local_430.ray + 0x200) = auVar44;
              auVar44 = vpmaskmovd_avx2(auVar88,*(undefined1 (*) [32])(local_430.hit + 0xa0));
              *(undefined1 (*) [32])(local_430.ray + 0x220) = auVar44;
              auVar44 = vpmaskmovd_avx2(auVar88,*(undefined1 (*) [32])(local_430.hit + 0xc0));
              *(undefined1 (*) [32])(local_430.ray + 0x240) = auVar44;
              auVar44 = vpmaskmovd_avx2(auVar88,*(undefined1 (*) [32])(local_430.hit + 0xe0));
              *(undefined1 (*) [32])(local_430.ray + 0x260) = auVar44;
              auVar44 = vpmaskmovd_avx2(auVar88,*(undefined1 (*) [32])(local_430.hit + 0x100));
              *(undefined1 (*) [32])(local_430.ray + 0x280) = auVar44;
            }
          }
          if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar40 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar40 >> 0x7f,0) == '\0') &&
                (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar40 >> 0xbf,0) == '\0') &&
              (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar40[0x1f]) {
            *(int *)(ray + k * 4 + 0x100) = auVar72._0_4_;
          }
          else {
            auVar72 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
          }
          *(undefined4 *)(local_400 + uVar25 * 4) = 0;
          uVar69 = auVar72._0_4_;
          auVar39._4_4_ = uVar69;
          auVar39._0_4_ = uVar69;
          auVar39._8_4_ = uVar69;
          auVar39._12_4_ = uVar69;
          auVar39._16_4_ = uVar69;
          auVar39._20_4_ = uVar69;
          auVar39._24_4_ = uVar69;
          auVar39._28_4_ = uVar69;
          auVar44 = vcmpps_avx(auVar61._0_32_,auVar39,2);
          local_400 = vandps_avx(auVar44,local_400);
          auVar58 = auVar54._28_36_;
        }
        auVar88 = auVar89._0_32_;
        auVar52 = auVar87._0_32_;
        auVar40 = auVar86._0_32_;
        auVar84 = auVar85._0_28_;
        auVar81 = auVar83._0_28_;
        auVar44 = auVar80._0_32_;
        if ((((((((local_400 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_400 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_400 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_400 >> 0x7f,0) == '\0') &&
              (local_400 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_400 >> 0xbf,0) == '\0') &&
            (local_400 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_400[0x1f]) goto LAB_018443b5;
        auVar44 = vblendvps_avx(auVar75._0_32_,auVar61._0_32_,local_400);
        auVar40 = vshufps_avx(auVar44,auVar44,0xb1);
        auVar40 = vminps_avx(auVar44,auVar40);
        auVar52 = vshufpd_avx(auVar40,auVar40,5);
        auVar40 = vminps_avx(auVar40,auVar52);
        auVar48 = vpermpd_avx2(auVar40,0x4e);
        auVar40 = vminps_avx(auVar40,auVar48);
        auVar40 = vcmpps_avx(auVar44,auVar40,0);
        auVar52 = local_400 & auVar40;
        auVar44 = local_400;
        if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar52 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar52 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar52 >> 0x7f,0) != '\0') ||
              (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar52 >> 0xbf,0) != '\0') ||
            (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar52[0x1f] < '\0') {
          auVar44 = vandps_avx(auVar40,local_400);
        }
        uVar23 = vmovmskps_avx(auVar44);
        uVar24 = 0;
        for (; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x80000000) {
          uVar24 = uVar24 + 1;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom, ray.time()[k]);
        const vbool<M> valid = sphere.valid();
        SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Intersect1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }